

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IsShadowTableOf(sqlite3 *db,Table *pTab,char *zName)

{
  char *z;
  code *UNRECOVERED_JUMPTABLE;
  uint N;
  int iVar1;
  undefined8 *puVar2;
  
  if (pTab->eTabType == '\x01') {
    z = pTab->zName;
    N = sqlite3Strlen30(z);
    iVar1 = sqlite3_strnicmp(zName,z,N);
    if ((iVar1 == 0) && (zName[N] == '_')) {
      puVar2 = (undefined8 *)sqlite3HashFind(&db->aModule,*(pTab->u).vtab.azArg);
      if ((puVar2 != (undefined8 *)0x0) &&
         ((2 < *(int *)*puVar2 &&
          (UNRECOVERED_JUMPTABLE = *(code **)((int *)*puVar2 + 0x2e),
          UNRECOVERED_JUMPTABLE != (code *)0x0)))) {
        iVar1 = (*UNRECOVERED_JUMPTABLE)(zName + (ulong)N + 1);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsShadowTableOf(sqlite3 *db, Table *pTab, const char *zName){
  int nName;                    /* Length of zName */
  Module *pMod;                 /* Module for the virtual table */

  if( !IsVirtual(pTab) ) return 0;
  nName = sqlite3Strlen30(pTab->zName);
  if( sqlite3_strnicmp(zName, pTab->zName, nName)!=0 ) return 0;
  if( zName[nName]!='_' ) return 0;
  pMod = (Module*)sqlite3HashFind(&db->aModule, pTab->u.vtab.azArg[0]);
  if( pMod==0 ) return 0;
  if( pMod->pModule->iVersion<3 ) return 0;
  if( pMod->pModule->xShadowName==0 ) return 0;
  return pMod->pModule->xShadowName(zName+nName+1);
}